

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::DescriptorFullName<google::protobuf::EnumDescriptor>
                   (EnumDescriptor *desc,bool is_descriptor)

{
  string *psVar1;
  byte in_DL;
  EnumDescriptor *in_RSI;
  string *in_RDI;
  string *psVar2;
  string *in_stack_ffffffffffffff88;
  string local_70 [55];
  allocator local_39;
  string local_38 [39];
  byte local_11;
  
  local_11 = in_DL & 1;
  psVar2 = in_RDI;
  if (local_11 == 0) {
    psVar1 = EnumDescriptor::full_name_abi_cxx11_(in_RSI);
    std::__cxx11::string::string((string *)in_RDI,(string *)psVar1);
  }
  else {
    EnumDescriptor::full_name_abi_cxx11_(in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"google.protobuf",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_70,"google.protobuf.internal",(allocator *)&stack0xffffffffffffff8f);
    StringReplace(in_stack_ffffffffffffff88,psVar2,in_RDI,SUB81((ulong)&local_39 >> 0x38,0));
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return psVar2;
}

Assistant:

std::string DescriptorFullName(const DescriptorType* desc, bool is_descriptor) {
  if (is_descriptor) {
    return StringReplace(desc->full_name(),
                         "google.protobuf",
                         "google.protobuf.internal", false);
  } else {
    return desc->full_name();
  }
}